

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O1

void build_alloc(void *base,guard *guard,size_t size)

{
  memdesc *pmVar1;
  memdesc_node *pmVar2;
  unsigned_long uVar3;
  int iVar4;
  memdesc *pmVar5;
  ulong uVar6;
  char *pcVar7;
  char *msg;
  undefined8 local_38;
  
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&descriptors_lock);
  pmVar5 = hdbg.descriptors.tqh_first;
  if (iVar4 == 0) {
    if (hdbg.descriptors.tqh_first == (memdesc *)0x0) {
      iVar4 = pthread_mutex_unlock((pthread_mutex_t *)&descriptors_lock);
      if (iVar4 == 0) {
        pmVar5 = (memdesc *)
                 (*real_malloc)(CONCAT44(hdbg.maxframes._4_4_,(int)hdbg.maxframes) * 8 + 0x30);
        goto LAB_001015b2;
      }
    }
    else {
      pmVar1 = ((hdbg.descriptors.tqh_first)->node).tqe_next;
      pmVar2 = &pmVar1->node;
      if (pmVar1 == (memdesc *)0x0) {
        pmVar2 = (memdesc_node *)&hdbg.descriptors;
      }
      pmVar2->tqe_prev = ((hdbg.descriptors.tqh_first)->node).tqe_prev;
      *(pmVar5->node).tqe_prev = pmVar1;
      iVar4 = pthread_mutex_unlock((pthread_mutex_t *)&descriptors_lock);
      if (iVar4 == 0) {
LAB_001015b2:
        guard->desc = pmVar5;
        pmVar5->data = guard;
        pmVar5->len = size;
        pmVar5->base = base;
        *(undefined4 *)((long)&guard[1].desc + size) = 0xa5a5a5a5;
        pmVar5->data->state = mem_allocated;
        getstacktrace(pmVar5->stack,(int)hdbg.maxframes);
        iVar4 = pthread_mutex_lock((pthread_mutex_t *)&heap_lock);
        if (iVar4 != 0) goto LAB_001016ac;
        uVar3 = hdbg.serial + 1;
        pmVar5->serial = hdbg.serial;
        hdbg.serial = uVar3;
        hdbg.stats.alloc_total = hdbg.stats.alloc_total + size;
        if ((hdbg.stats.maxmem < hdbg.stats.alloc_total) &&
           (hdbg.stats.maxmem = hdbg.stats.alloc_total,
           hdbg.alloc_limit < hdbg.stats.alloc_total && hdbg.alloc_limit != 0)) {
          die("exceeded set memory limit");
        }
        (pmVar5->node).tqe_next = hdbg.heap.tqh_first;
        if (hdbg.heap.tqh_first == (memdesc *)0x0) {
          hdbg.heap.tqh_first = (memdesc *)&hdbg;
        }
        ((memdesc_node *)&((hdbg_info *)hdbg.heap.tqh_first)->heap)->tqe_prev = (memdesc **)pmVar5;
        hdbg.heap.tqh_first = pmVar5;
        (pmVar5->node).tqe_prev = (memdesc **)&hdbg;
        iVar4 = pthread_mutex_unlock((pthread_mutex_t *)&heap_lock);
        if (iVar4 == 0) {
          local_38 = 0xbaadf00d;
          if ((0 < (int)(uint)size) && (hdbg.doFill != 0)) {
            uVar6 = 0;
            do {
              *(undefined1 *)((long)&guard[1].desc + uVar6) =
                   *(undefined1 *)((long)&local_38 + (ulong)((uint)uVar6 & 3));
              uVar6 = uVar6 + 1;
            } while (((uint)size & 0x7fffffff) != uVar6);
          }
          return;
        }
      }
    }
    pcVar7 = strerror(iVar4);
    msg = "unlock failed: %s";
  }
  else {
LAB_001016ac:
    pcVar7 = strerror(iVar4);
    msg = "lock failed: %s";
  }
  die(msg,pcVar7);
}

Assistant:

static inline void build_alloc(void *base, struct guard *guard, size_t size) {
    struct memdesc *desc;
    LOCK(&descriptors_lock);
    if (TAILQ_EMPTY(&hdbg.descriptors)) {
        UNLOCK(&descriptors_lock);
        desc = real_malloc(sizeof (struct memdesc) +
              sizeof (void *) * (hdbg.maxframes - 1));
    } else {
        desc = TAILQ_FIRST(&hdbg.descriptors);
        TAILQ_REMOVE(&hdbg.descriptors, desc, node);
        UNLOCK(&descriptors_lock);
    }
    guard->desc = desc;
    desc->data = guard;
    desc->len = size;
    desc->base = base;
    set_state(desc, mem_allocated);
    getstacktrace(desc->stack, hdbg.maxframes);

    LOCK(&heap_lock);
    desc->serial = hdbg.serial++;
    hdbg.stats.alloc_total += size;
    if (hdbg.stats.alloc_total > hdbg.stats.maxmem) {
        hdbg.stats.maxmem = hdbg.stats.alloc_total;
        if (hdbg.alloc_limit && hdbg.stats.alloc_total > hdbg.alloc_limit)
           die("exceeded set memory limit");
        hdbg.stats.maxmem = hdbg.stats.alloc_total;
    }
    TAILQ_INSERT_HEAD(&hdbg.heap, desc, node);
    UNLOCK(&heap_lock);
    fill(guard + 1, size, 0xbaadf00d);
}